

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  LogMessage *other;
  uint32_t *puVar4;
  FieldDescriptor *f;
  OneofFieldMover<true> local_f1;
  FieldDescriptor *pFStack_f0;
  OneofFieldMover<true> mover;
  FieldDescriptor *field_lhs;
  MessageWrapper rhs_wrapper;
  undefined1 auStack_c8 [8];
  MessageWrapper lhs_wrapper;
  undefined1 local_a8 [8];
  LocalVarWrapper temp;
  uint32 oneof_case_rhs;
  uint32 oneof_case_lhs;
  byte local_61;
  LogMessage local_60;
  OneofDescriptor *local_28;
  OneofDescriptor *oneof_descriptor_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  local_28 = oneof_descriptor;
  oneof_descriptor_local = (OneofDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  bVar3 = OneofDescriptor::is_synthetic(oneof_descriptor);
  local_61 = 0;
  if (bVar3) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    local_61 = 1;
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&oneof_case_rhs + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  temp.string_val.field_2._12_4_ = GetOneofCase(this,rhs_local,local_28);
  temp.string_val.field_2._8_4_ = GetOneofCase(this,(Message *)oneof_descriptor_local,local_28);
  SwapOneofField<true>::LocalVarWrapper::LocalVarWrapper((LocalVarWrapper *)local_a8);
  pFStack_f0 = (FieldDescriptor *)0x0;
  if (temp.string_val.field_2._12_4_ != 0) {
    pFStack_f0 = Descriptor::FindFieldByNumber(this->descriptor_,temp.string_val.field_2._12_4_);
    lhs_wrapper.reflection = (Reflection *)rhs_local;
    auStack_c8 = (undefined1  [8])this;
    lhs_wrapper.message = (Message *)pFStack_f0;
    (anonymous_namespace)::OneofFieldMover<true>::operator()
              (&local_f1,pFStack_f0,(MessageWrapper *)auStack_c8,(LocalVarWrapper *)local_a8);
  }
  if (temp.string_val.field_2._8_4_ != 0) {
    rhs_wrapper.message =
         (Message *)Descriptor::FindFieldByNumber(this->descriptor_,temp.string_val.field_2._8_4_);
    lhs_wrapper.reflection = (Reflection *)rhs_local;
    rhs_wrapper.reflection = (Reflection *)oneof_descriptor_local;
    field_lhs = (FieldDescriptor *)this;
    auStack_c8 = (undefined1  [8])this;
    lhs_wrapper.message = rhs_wrapper.message;
    (anonymous_namespace)::OneofFieldMover<true>::operator()
              (&local_f1,(FieldDescriptor *)rhs_wrapper.message,(MessageWrapper *)&field_lhs,
               (MessageWrapper *)auStack_c8);
  }
  if (temp.string_val.field_2._12_4_ != 0) {
    rhs_wrapper.message = (Message *)pFStack_f0;
    rhs_wrapper.reflection = (Reflection *)oneof_descriptor_local;
    field_lhs = (FieldDescriptor *)this;
    (anonymous_namespace)::OneofFieldMover<true>::operator()
              (&local_f1,pFStack_f0,(LocalVarWrapper *)local_a8,(MessageWrapper *)&field_lhs);
  }
  uVar1 = temp.string_val.field_2._8_4_;
  puVar4 = MutableOneofCase(this,rhs_local,local_28);
  uVar2 = temp.string_val.field_2._12_4_;
  *puVar4 = uVar1;
  puVar4 = MutableOneofCase(this,(Message *)oneof_descriptor_local,local_28);
  *puVar4 = uVar2;
  SwapOneofField<true>::LocalVarWrapper::~LocalVarWrapper((LocalVarWrapper *)local_a8);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}